

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O0

handle * __thiscall
gmlc::libguarded::shared_guarded_opt<int,std::shared_timed_mutex>::
try_lock_until<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
          (handle *__return_storage_ptr__,void *this,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *timepoint)

{
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_R8;
  unique_lock<std::shared_timed_mutex> local_30;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *local_20;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *timepoint_local;
  shared_guarded_opt<int,_std::shared_timed_mutex> *this_local;
  
  local_20 = timepoint;
  timepoint_local =
       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        *)this;
  this_local = (shared_guarded_opt<int,_std::shared_timed_mutex> *)__return_storage_ptr__;
  if ((*(byte *)((long)this + 0x40) & 1) == 0) {
    std::unique_lock<std::shared_timed_mutex>::unique_lock(&local_30);
    lock_handle<int,_std::shared_timed_mutex>::lock_handle
              (__return_storage_ptr__,(pointer)this,&local_30);
    std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_30);
  }
  else {
    try_lock_handle_until<int,std::shared_timed_mutex,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (__return_storage_ptr__,(libguarded *)this,(int *)((long)this + 8),
               (shared_timed_mutex *)timepoint,in_R8);
  }
  return __return_storage_ptr__;
}

Assistant:

auto shared_guarded_opt<T, M>::try_lock_until(const TimePoint& timepoint)
    -> handle
{
    return (enabled) ? try_lock_handle_until(&m_obj, m_mutex, timepoint) :
                       handle(&m_obj, std::unique_lock<M>{});
}